

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O1

string * prompt_filename_abi_cxx11_(string *__return_storage_ptr__,FileType *type)

{
  char cVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter the name of the ",0x1d);
  pcVar2 = "out";
  if (*type == in) {
    pcVar2 = "in";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar2,(ulong)(*type == in) ^ 3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," file: ",7);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x78);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__,cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string prompt_filename(const FileType& type)
{
	std::cout << "Please enter the name of the "
		<< (type == FileType::in ? "in" : "out")
		<< " file: ";
	std::string filename;
	std::getline(std::cin, filename);
	return filename;
}